

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void phmap::priv::(anonymous_namespace)::
     DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
               (char *param_1,
               multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               *b,vector<int,_std::allocator<int>_> *values)

{
  size_type sVar1;
  size_type sVar2;
  tuple<phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  tVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  size_t sVar6;
  _Base_ptr p_Var7;
  size_type sVar8;
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  _Var9;
  iterator iVar10;
  _Rb_tree_node_base *__tmp;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *pbVar11;
  node_type *pnVar12;
  undefined1 *siglen;
  undefined1 *siglen_00;
  undefined1 *siglen_01;
  undefined1 *siglen_02;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sig;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  uchar *sig_00;
  _Base_ptr p_Var13;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var14;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *puVar15;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_08;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_10;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_11;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_13;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_14;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_16;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_17;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_19;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_20;
  long lVar16;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  _Var18;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *rhs;
  char *pcVar19;
  AssertHelper *pAVar20;
  AssertHelper *pAVar21;
  size_t in_R9;
  int *__v;
  ulong uVar22;
  AssertionResult AVar23;
  iterator iVar24;
  const_iterator cVar25;
  const_iterator cVar26;
  iterator iVar27;
  iterator iVar28;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  b_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  b_01;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  b_02;
  iterator begin;
  iterator begin_00;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  e;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  e_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  e_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  iterator end_02;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  b_range;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  b_copy;
  undefined1 local_178 [8];
  int local_170;
  undefined4 uStack_16c;
  AssertHelper local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  AssertHelper local_158;
  undefined1 local_150 [8];
  int local_148;
  undefined4 uStack_144;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_130;
  AssertHelper local_100;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  local_f8;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  local_a8;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_58;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *local_50;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *local_48;
  long local_40;
  ulong local_38;
  EVP_PKEY_CTX *ctx;
  
  siglen = local_178;
  siglen_00 = local_178;
  siglen_01 = local_178;
  siglen_02 = local_178;
  _Var18._M_head_impl =
       *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
         **)&(b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  ;
  if ((b->
      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ).tree_.
      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
      .
      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
      .tree_.rightmost_ != _Var18._M_head_impl) {
    lVar16 = 0;
    uVar22 = 0;
    do {
      anon_unknown_0::
      multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::insert((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)param_1,(value_type *)((long)_Var18._M_head_impl + lVar16));
      base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::value_check((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     *)param_1,
                    (value_type *)
                    ((long)(b->
                           super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                           ).tree_.
                           super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                           .
                           super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                           .tree_.root_.
                           super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                    + lVar16));
      uVar22 = uVar22 + 1;
      _Var18._M_head_impl =
           *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
             **)&(b->
                 super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 ).tree_.
                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                 .tree_.root_.
                 super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
      ;
      lVar16 = lVar16 + 4;
    } while (uVar22 < (ulong)((long)(b->
                                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                    ).tree_.
                                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .
                                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .tree_.rightmost_ - (long)_Var18._M_head_impl >> 2));
  }
  local_a8.tree_.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
         ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 *)param_1);
  pbVar11 = &local_a8;
  local_f8.tree_.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )((long)(b->
                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.rightmost_ -
          (long)(b->
                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
         >> 2);
  rhs = &local_f8;
  AVar23 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                     ((internal *)local_150,"mutable_b.size()","values.size()",
                      (unsigned_long *)pbVar11,(unsigned_long *)rhs);
  sig._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar23.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_150[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1b0,pcVar19);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(ulong *)local_a8.tree_.
                             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .tree_.root_.
                             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                             ._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_144,local_148) ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_144,local_148));
    return;
  }
  pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148);
  if (pbVar17 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,pbVar17);
    sig._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         extraout_RDX._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  ::verify((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            *)param_1,(EVP_PKEY_CTX *)pbVar17,
           (uchar *)sig._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,(size_t)pbVar11,(uchar *)rhs,in_R9);
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  ::base_checker(&local_a8,
                 (base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  *)param_1);
  local_f8.tree_.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
         ::size(&local_a8);
  sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
          ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  *)param_1);
  local_178._0_4_ = (undefined4)sVar8;
  local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_150,"b_copy.size()","const_b.size()",(unsigned_long *)&local_f8,
             (unsigned_long *)local_178);
  if (local_150[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1b6,pcVar19);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(ulong *)local_f8.tree_.
                             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .tree_.root_.
                             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                             ._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_144,local_148) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_144,local_148));
  }
  _Var9.
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
         *)&(b->
            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ).tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .tree_.root_.
            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  ;
  if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
       )(b->
        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ).tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ !=
      _Var9.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
      ._M_head_impl) {
    uVar22 = 0;
    do {
      iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find(&local_a8,
                      (key_type *)
                      ((long)_Var9.
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                             ._M_head_impl + uVar22 * 4));
      if (((undefined1  [16])iVar24 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_0015228b;
      if (*(int *)(iVar24.node + (long)iVar24.position * 4 + 0xc) !=
          *(int *)((long)(b->
                         super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                         ).tree_.
                         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                         .tree_.root_.
                         super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                  + uVar22 * 4)) goto LAB_0015226c;
      uVar22 = uVar22 + 1;
      _Var9.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
      ._M_head_impl =
           *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             *)&(b->
                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
      ;
    } while (uVar22 < (ulong)((long)(b->
                                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                    ).tree_.
                                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .
                                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .tree_.rightmost_ -
                              (long)_Var9.
                                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                    ._M_head_impl >> 2));
  }
  cVar25 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
           begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *)param_1);
  cVar26 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
           end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)param_1);
  b_00._12_4_ = 0;
  b_00.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
               *)SUB128(cVar25._0_12_,0);
  b_00.position = SUB124(cVar25._0_12_,8);
  e._12_4_ = 0;
  e.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *)SUB128(cVar26._0_12_,0);
  e.position = SUB124(cVar26._0_12_,8);
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  ::
  base_checker<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>const,int_const&,int_const*>>
            ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
              *)&local_f8,b_00,e);
  sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
          ::size(&local_f8);
  local_178._0_4_ = (undefined4)sVar8;
  local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
  local_168.data_ =
       (AssertHelperData *)
       base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
       ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               *)param_1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_150,"b_range.size()","const_b.size()",(unsigned_long *)local_178,
             (unsigned_long *)&local_168);
  if (local_150[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_178);
    if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1bd,pcVar19);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_144,local_148) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_144,local_148));
  }
  _Var9.
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
         *)&(b->
            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ).tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .tree_.root_.
            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  ;
  if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
       )(b->
        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ).tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ !=
      _Var9.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
      ._M_head_impl) {
    uVar22 = 0;
    do {
      iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find(&local_f8,
                      (key_type *)
                      ((long)_Var9.
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                             ._M_head_impl + uVar22 * 4));
      if (((undefined1  [16])iVar24 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_0015228b;
      if (*(int *)(iVar24.node + (long)iVar24.position * 4 + 0xc) !=
          *(int *)((long)(b->
                         super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                         ).tree_.
                         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                         .tree_.root_.
                         super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                  + uVar22 * 4)) goto LAB_0015226c;
      uVar22 = uVar22 + 1;
      _Var9.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
      ._M_head_impl =
           *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             *)&(b->
                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
      ;
    } while (uVar22 < (ulong)((long)(b->
                                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                    ).tree_.
                                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .
                                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                    .tree_.rightmost_ -
                              (long)_Var9.
                                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                    ._M_head_impl >> 2));
  }
  if (((ulong)local_a8.tree_.
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
              ._M_head_impl & 7) == 0) {
    if (((ulong)local_a8.tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.rightmost_ & 7) == 0) {
      ctx = *(EVP_PKEY_CTX **)
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
      b_01._8_8_ = 0;
      b_01.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)ctx;
      e_00.position._0_1_ =
           local_a8.tree_.
           super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
           .
           super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
           .tree_.rightmost_[10];
      e_00.node = local_a8.tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.rightmost_;
      e_00._9_7_ = 0;
      puVar15 = (uchar *)(ulong)(byte)local_a8.tree_.
                                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                      .
                                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                      .tree_.rightmost_[10];
      pnVar12 = local_a8.tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.rightmost_;
      multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
      ::
      insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
                ((multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                  *)&local_f8,b_01,e_00);
      base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::verify(&local_f8,ctx,sig_00,(size_t)pnVar12,puVar15,in_R9);
      base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::clear(&local_f8);
      if (((ulong)local_a8.tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.root_.
                  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                  ._M_head_impl & 7) != 0) goto LAB_001522aa;
      if (((ulong)local_a8.tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.rightmost_ & 7) == 0) {
        b_02._8_8_ = 0;
        b_02.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                     *)*(ulong *)local_a8.tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                 .tree_.root_.
                                 super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                 ._M_head_impl;
        e_01.position._0_1_ =
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.rightmost_[10];
        e_01.node = local_a8.tree_.
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .tree_.rightmost_;
        e_01._9_7_ = 0;
        multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
        ::
        insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
                  ((multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                    *)&local_f8,b_02,e_01);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_f8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(&local_a8);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_150,"b_range.size()","b_copy.size()",(unsigned_long *)local_178
                   ,(unsigned_long *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1c9,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        _Var9.
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
               *)&(b->
                  super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  ).tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.root_.
                  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             )(b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              ).tree_.
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .tree_.rightmost_ !=
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl) {
          uVar22 = 0;
          do {
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::find(&local_f8,
                            (key_type *)
                            ((long)_Var9.
                                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                   ._M_head_impl + uVar22 * 4));
            if (((undefined1  [16])iVar24 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
            goto LAB_0015228b;
            if (*(int *)(iVar24.node + (long)iVar24.position * 4 + 0xc) !=
                *(int *)((long)(b->
                               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                        + uVar22 * 4)) goto LAB_0015226c;
            uVar22 = uVar22 + 1;
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl =
                 *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                   *)&(b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      ).tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .tree_.root_.
                      super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)_Var9.
                                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                          ._M_head_impl >> 2));
        }
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_f8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(&local_a8);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_150,"b_range.size()","b_copy.size()",(unsigned_long *)local_178
                   ,(unsigned_long *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1d0,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::clear(&local_f8);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_f8,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_f8.checker_._M_t,&local_a8.checker_._M_t);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_f8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(&local_a8);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_150,"b_range.size()","b_copy.size()",(unsigned_long *)local_178
                   ,(unsigned_long *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1d5,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::clear(&local_f8);
        p_Var7 = local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        sVar6 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        p_Var5 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        p_Var4 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var13 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        sVar1 = local_f8.tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.size_;
        pnVar12 = local_f8.tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.rightmost_;
        tVar3.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             local_f8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             tVar3.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ =
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.rightmost_;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.size_ = local_a8.tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.size_;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ = pnVar12;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.size_ = sVar1;
        if (local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          if (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            pbVar11 = &local_a8;
            (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
            goto LAB_00151250;
          }
        }
        else if (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
                 (_Base_ptr)0x0) {
          pbVar11 = &local_f8;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_00151250:
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          p_Var13 = &(pbVar11->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
          p_Var13->_M_parent = (_Base_ptr)0x0;
          p_Var13->_M_left = p_Var13;
          p_Var13->_M_right = p_Var13;
          *(undefined8 *)(p_Var13 + 1) = 0;
        }
        else {
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var13;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var5;
          p_Var7->_M_parent = &local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var13->_M_parent = &local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
          local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar6;
        }
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_a8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ = local_168.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_150,"b_copy.size()","0",(unsigned_long *)local_178,
                   (int *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1da,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_f8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     *)param_1);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_150,"b_range.size()","const_b.size()",
                   (unsigned_long *)local_178,(unsigned_long *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1db,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        _Var9.
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
               *)&(b->
                  super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  ).tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.root_.
                  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             )(b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              ).tree_.
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .tree_.rightmost_ !=
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl) {
          uVar22 = 0;
          do {
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::find(&local_f8,
                            (key_type *)
                            ((long)_Var9.
                                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                   ._M_head_impl + uVar22 * 4));
            if (((undefined1  [16])iVar24 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
            goto LAB_0015228b;
            if (*(int *)(iVar24.node + (long)iVar24.position * 4 + 0xc) !=
                *(int *)((long)(b->
                               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                        + uVar22 * 4)) goto LAB_0015226c;
            uVar22 = uVar22 + 1;
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl =
                 *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                   *)&(b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      ).tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .tree_.root_.
                      super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)_Var9.
                                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                          ._M_head_impl >> 2));
        }
        p_Var7 = local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        sVar6 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        p_Var5 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        p_Var4 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var13 = local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        sVar1 = local_f8.tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                .tree_.size_;
        pnVar12 = local_f8.tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.rightmost_;
        tVar3.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
              )(_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                )local_f8.tree_.
                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                 .tree_.root_;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             tVar3.
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             ._M_head_impl;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ =
             local_a8.tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
             .tree_.rightmost_;
        local_f8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.size_ = local_a8.tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.size_;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.rightmost_ = pnVar12;
        local_a8.tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.size_ = sVar1;
        if (local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          if (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) goto LAB_0015152d;
          pbVar11 = &local_a8;
          (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          if (local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var13;
            local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
            local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var5;
            p_Var7->_M_parent = &local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var13->_M_parent = &local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
            local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar6;
            goto LAB_0015152d;
          }
          pbVar11 = &local_f8;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header;
          local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
               local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        p_Var13 = &(pbVar11->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        local_f8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_a8.checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        p_Var13->_M_parent = (_Base_ptr)0x0;
        p_Var13->_M_left = p_Var13;
        p_Var13->_M_right = p_Var13;
        *(undefined8 *)(p_Var13 + 1) = 0;
LAB_0015152d:
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::base_checker((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_150,&local_f8);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_f8,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_f8.checker_._M_t,&local_a8.checker_._M_t);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)local_150);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_a8.checker_._M_t,&local_130);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_130);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        ~btree((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)local_150);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_a8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ = local_168.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_150,"b_copy.size()","0",(unsigned_long *)local_178,
                   (int *)&local_168);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1e3,pcVar19);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&local_f8);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     *)param_1);
        pAVar20 = &local_168;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_150,"b_range.size()","const_b.size()",
                   (unsigned_long *)local_178,(unsigned_long *)pAVar20);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pAVar20 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar20 = *(AssertHelper **)CONCAT44(uStack_144,local_148);
          }
          siglen = (undefined1 *)0x1e4;
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1e4,(char *)pAVar20);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        _Var9.
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl =
             *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
               *)&(b->
                  super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  ).tree_.
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                  .tree_.root_.
                  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
             )(b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              ).tree_.
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
              .tree_.rightmost_ !=
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl) {
          uVar22 = 0;
          do {
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::find(&local_f8,
                            (key_type *)
                            ((long)_Var9.
                                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                                   ._M_head_impl + uVar22 * 4));
            if (((undefined1  [16])iVar24 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
            goto LAB_0015228b;
            if (*(int *)(iVar24.node + (long)iVar24.position * 4 + 0xc) !=
                *(int *)((long)(b->
                               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                        + uVar22 * 4)) goto LAB_0015226c;
            uVar22 = uVar22 + 1;
            _Var9.
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
            ._M_head_impl =
                 *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                   *)&(b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      ).tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                      .tree_.root_.
                      super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
            siglen = (undefined1 *)
                     ((long)(b->
                            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                            ).tree_.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .tree_.rightmost_ -
                      (long)_Var9.
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                            ._M_head_impl >> 2);
          } while (uVar22 < siglen);
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::base_checker((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_150,&local_f8);
        local_48 = (base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    *)param_1;
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_f8,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_f8.checker_._M_t,&local_a8.checker_._M_t);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)local_150);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_a8.checker_._M_t,&local_130);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_130);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        ~btree((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)local_150);
        _Var18._M_head_impl =
             *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
               **)&(b->
                   super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_00.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        local_50 = b;
        if ((b->
            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ).tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .tree_.rightmost_ != _Var18._M_head_impl) {
          lVar16 = 0;
          uVar22 = 0;
          do {
            pbVar11 = local_48;
            base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ::erase(local_48,(key_type *)((long)_Var18._M_head_impl + lVar16));
            local_178._0_4_ =
                 base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 ::erase(pbVar11,(key_type *)
                                 ((long)(local_50->
                                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                        ).tree_.
                                        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                        .
                                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                        .tree_.root_.
                                        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                 + lVar16));
            local_168.data_ = local_168.data_ & 0xffffffff00000000;
            siglen = local_178;
            pAVar20 = &local_168;
            AVar23 = testing::internal::CmpHelperEQ<int,int>
                               ((internal *)local_150,"mutable_b.erase(key_of_value(values[i]))","0"
                                ,(int *)local_178,(int *)&local_168);
            b = local_50;
            _Var14._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 AVar23.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if (local_150[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_178);
              if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
                pcVar19 = "";
              }
              else {
                pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_168,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x1ee,pcVar19);
              testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_168);
              if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(uStack_144,local_148) !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_148,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(uStack_144,local_148));
              }
              goto LAB_00152226;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uStack_144,local_148) !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(uStack_144,local_148));
              _Var14 = extraout_RDX_01.
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
            }
            uVar22 = uVar22 + 1;
            _Var18._M_head_impl =
                 *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   **)&(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
            lVar16 = lVar16 + 4;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ - (long)_Var18._M_head_impl >> 2));
        }
        pbVar11 = local_48;
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(local_48,(EVP_PKEY_CTX *)_Var18._M_head_impl,(uchar *)_Var14._M_head_impl,
                 (size_t)siglen,(uchar *)pAVar20,in_R9);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(pbVar11);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        pAVar20 = &local_168;
        local_168.data_ = local_168.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_150,"const_b.size()","0",(unsigned_long *)local_178,
                   (int *)pAVar20);
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pAVar20 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar20 = *(AssertHelper **)CONCAT44(uStack_144,local_148);
          }
          siglen_00 = (undefined1 *)0x1f2;
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1f2,(char *)pAVar20);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
        }
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)pbVar11,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        local_58 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &pbVar11->checker_;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_58,&local_a8.checker_._M_t);
        _Var18._M_head_impl =
             *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
               **)&(b->
                   super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        puVar15 = extraout_RDX_02;
        if ((b->
            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ).tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .tree_.rightmost_ != _Var18._M_head_impl) {
          lVar16 = 0;
          uVar22 = 0;
          do {
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::find(pbVar11,(key_type *)((long)_Var18._M_head_impl + lVar16));
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::erase(pbVar11,iVar24);
            puVar15 = iVar24._8_8_;
            uVar22 = uVar22 + 1;
            _Var18._M_head_impl =
                 *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   **)&(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
            lVar16 = lVar16 + 4;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ - (long)_Var18._M_head_impl >> 2));
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)_Var18._M_head_impl,puVar15,(size_t)siglen_00,
                 (uchar *)pAVar20,in_R9);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(pbVar11);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        pAVar20 = &local_168;
        local_168.data_ = local_168.data_ & 0xffffffff00000000;
        AVar23 = testing::internal::CmpHelperEQ<unsigned_long,int>
                           ((internal *)local_150,"const_b.size()","0",(unsigned_long *)local_178,
                            (int *)pAVar20);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar23.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pAVar20 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar20 = *(AssertHelper **)CONCAT44(uStack_144,local_148);
          }
          siglen_01 = (undefined1 *)0x1fb;
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x1fb,(char *)pAVar20);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          _Var14 = extraout_RDX_03.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
            _Var14._M_head_impl = extraout_RDX_04;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_144,local_148) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_144,local_148));
          _Var14._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_05.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        _Var18._M_head_impl =
             *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
               **)&(b->
                   super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        ;
        if ((b->
            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ).tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
            .tree_.rightmost_ != _Var18._M_head_impl) {
          lVar16 = 0;
          uVar22 = 0;
          do {
            local_40 = lVar16;
            local_38 = uVar22;
            iVar24 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     ::upper_bound(pbVar11,(key_type *)((long)_Var18._M_head_impl + lVar16));
            __v = (int *)((long)(local_50->
                                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                         + local_40);
            sVar1 = (pbVar11->tree_).
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .tree_.size_;
            iVar10 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                     _M_insert_equal<int_const&>(local_58,__v);
            iVar27._12_4_ = 0;
            iVar27.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                           *)SUB128(iVar24._0_12_,0);
            iVar27.position = SUB124(iVar24._0_12_,8);
            iVar27 = btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                     ::insert_hint_multi<int_const&>
                               ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                                 *)pbVar11,iVar27,__v);
            pbVar11 = local_48;
            if (((undefined1  [16])iVar27 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
            goto LAB_0015228b;
            if (*(_Rb_tree_color *)(iVar27.node + (long)iVar27.position * 4 + 0xc) !=
                iVar10._M_node[1]._M_color) {
LAB_0015226c:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                            ,0x49,
                            "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = int, U = int]"
                           );
            }
            sVar2 = (local_48->tree_).
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .tree_.size_;
            local_178._0_4_ = (undefined4)sVar2;
            local_178._4_4_ = (undefined4)(sVar2 >> 0x20);
            local_168.data_ =
                 (AssertHelperData *)
                 (local_48->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)local_150,"this->tree_.size()","this->checker_.size()",
                       (unsigned_long *)local_178,(unsigned_long *)&local_168);
            if (local_150[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_178);
              pcVar19 = "";
              if ((undefined8 *)CONCAT44(uStack_144,local_148) != (undefined8 *)0x0) {
                pcVar19 = *(char **)CONCAT44(uStack_144,local_148);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_168,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x198,pcVar19);
              testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_168);
              if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uStack_144,local_148) !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(uStack_144,local_148));
            }
            sVar2 = (pbVar11->tree_).
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                    .tree_.size_;
            local_178._0_4_ = (undefined4)sVar2;
            local_178._4_4_ = (undefined4)(sVar2 >> 0x20);
            local_168.data_ = (AssertHelperData *)(sVar1 + 1);
            pAVar20 = &local_168;
            siglen_01 = local_178;
            AVar23 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                               ((internal *)local_150,"this->tree_.size()","size + 1",
                                (unsigned_long *)local_178,(unsigned_long *)pAVar20);
            uVar22 = local_38;
            lVar16 = local_40;
            b = local_50;
            _Var14._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 AVar23.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if (local_150[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_178);
              pAVar20 = (AssertHelper *)0x40542f;
              if ((undefined8 *)CONCAT44(uStack_144,local_148) != (undefined8 *)0x0) {
                pAVar20 = *(AssertHelper **)CONCAT44(uStack_144,local_148);
              }
              siglen_01 = (undefined1 *)0x199;
              testing::internal::AssertHelper::AssertHelper
                        (&local_168,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x199,(char *)pAVar20);
              testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_168);
              _Var14._M_head_impl = extraout_RDX_06;
              if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
                _Var14._M_head_impl = extraout_RDX_07;
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uStack_144,local_148) !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(uStack_144,local_148));
              _Var14._M_head_impl = extraout_RDX_08._M_head_impl;
            }
            uVar22 = uVar22 + 1;
            _Var18._M_head_impl =
                 *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   **)&(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
            ;
            lVar16 = lVar16 + 4;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ - (long)_Var18._M_head_impl >> 2));
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)_Var18._M_head_impl,(uchar *)_Var14._M_head_impl,
                 (size_t)siglen_01,(uchar *)pAVar20,in_R9);
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)pbVar11);
        iVar28 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                        *)pbVar11);
        iVar24._12_4_ = 0;
        iVar24.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                       *)SUB128(iVar27._0_12_,0);
        iVar24.position = SUB124(iVar27._0_12_,8);
        end._12_4_ = 0;
        end.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                    *)SUB128(iVar28._0_12_,0);
        end.position = SUB124(iVar28._0_12_,8);
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::erase(pbVar11,iVar24,end);
        sVar8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(pbVar11);
        local_178._0_4_ = (undefined4)sVar8;
        local_178._4_4_ = (undefined4)(sVar8 >> 0x20);
        pAVar20 = &local_168;
        local_168.data_ = local_168.data_ & 0xffffffff00000000;
        AVar23 = testing::internal::CmpHelperEQ<unsigned_long,int>
                           ((internal *)local_150,"mutable_b.size()","0",(unsigned_long *)local_178,
                            (int *)pAVar20);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar23.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (local_150[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_178);
          if ((undefined8 *)CONCAT44(uStack_144,local_148) == (undefined8 *)0x0) {
            pAVar20 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar20 = *(AssertHelper **)CONCAT44(uStack_144,local_148);
          }
          siglen_02 = (undefined1 *)0x206;
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x206,(char *)pAVar20);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          _Var14 = extraout_RDX_09.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
            _Var14._M_head_impl = extraout_RDX_10;
          }
        }
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(uStack_144,local_148);
        if (pbVar17 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_148,pbVar17);
          _Var14._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_11.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)pbVar17,(uchar *)_Var14._M_head_impl,(size_t)siglen_02,
                 (uchar *)pAVar20,in_R9);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)pbVar11,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_58,&local_a8.checker_._M_t);
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)pbVar11);
        local_150[0] = iVar27.node._0_1_;
        local_150._1_7_ = iVar27.node._1_7_;
        local_148 = iVar27.position;
        if (4 < (ulong)((long)(b->
                              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                              ).tree_.
                              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                              .
                              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                              .tree_.rightmost_ -
                       (long)(b->
                             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                             ).tree_.
                             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .tree_.root_.
                             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                       )) {
          uVar22 = 0;
          do {
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
            ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                         *)local_150);
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.root_.
                                          super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                   >> 2) >> 1);
        }
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)pbVar11);
        end_00.node._1_7_ = local_150._1_7_;
        end_00.node._0_1_ = local_150[0];
        end_00.position = local_148;
        end_00._12_4_ = 0;
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::erase(pbVar11,iVar27,end_00);
        local_168.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(pbVar11);
        pAVar20 = &local_168;
        uVar22 = (long)(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.rightmost_ -
                 (long)(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                 >> 2;
        local_158.data_ = (AssertHelperData *)(uVar22 - (uVar22 >> 1));
        pAVar21 = &local_158;
        AVar23 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                           ((internal *)local_178,"mutable_b.size()",
                            "values.size() - values.size() / 2",(unsigned_long *)pAVar20,
                            (unsigned_long *)pAVar21);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar23.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (local_178[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_168);
          if ((undefined8 *)CONCAT44(uStack_16c,local_170) == (undefined8 *)0x0) {
            pAVar21 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar21 = *(AssertHelper **)CONCAT44(uStack_16c,local_170);
          }
          pAVar20 = (AssertHelper *)0x20e;
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x20e,(char *)pAVar21);
          testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          _Var14 = extraout_RDX_12.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if (local_168.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_168.data_ + 8))();
            _Var14._M_head_impl = extraout_RDX_13;
          }
        }
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(uStack_16c,local_170);
        if (pbVar17 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_170,pbVar17);
          _Var14._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_14.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)pbVar17,(uchar *)_Var14._M_head_impl,(size_t)pAVar20,
                 (uchar *)pAVar21,in_R9);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)pbVar11,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_58,&local_a8.checker_._M_t);
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)pbVar11);
        local_178._0_4_ = iVar27.node._0_4_;
        local_178._4_4_ = iVar27.node._4_4_;
        local_170 = iVar27.position;
        if (4 < (ulong)((long)(b->
                              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                              ).tree_.
                              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                              .
                              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                              .tree_.rightmost_ -
                       (long)(b->
                             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                             ).tree_.
                             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                             .tree_.root_.
                             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                       )) {
          uVar22 = 0;
          do {
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
            ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                         *)local_178);
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.root_.
                                          super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                   >> 2) >> 1);
        }
        begin.node._4_4_ = local_178._4_4_;
        begin.node._0_4_ = local_178._0_4_;
        begin.position = local_170;
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                        *)pbVar11);
        begin._12_4_ = 0;
        end_01._12_4_ = 0;
        end_01.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                       *)SUB128(iVar27._0_12_,0);
        end_01.position = SUB124(iVar27._0_12_,8);
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::erase(pbVar11,begin,end_01);
        local_158.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(pbVar11);
        pAVar20 = &local_158;
        local_100.data_ =
             (AssertHelperData *)
             ((ulong)((long)(b->
                            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                            ).tree_.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .tree_.rightmost_ -
                      (long)(b->
                            super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                            ).tree_.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                     >> 2) >> 1);
        pAVar21 = &local_100;
        AVar23 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                           ((internal *)&local_168,"mutable_b.size()","values.size() / 2",
                            (unsigned_long *)pAVar20,(unsigned_long *)pAVar21);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar23.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (local_168.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_158);
          if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pAVar21 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar21 = (AssertHelper *)(local_160->_M_dataplus)._M_p;
          }
          pAVar20 = (AssertHelper *)0x216;
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x216,(char *)pAVar21);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          _Var14 = extraout_RDX_15.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if (local_158.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_158.data_ + 8))();
            _Var14._M_head_impl = extraout_RDX_16;
          }
        }
        pbVar17 = local_160;
        if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_160,local_160);
          _Var14._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_17.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)pbVar17,(uchar *)_Var14._M_head_impl,(size_t)pAVar20,
                 (uchar *)pAVar21,in_R9);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        operator=((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)pbVar11,
                  (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)&local_a8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_58,&local_a8.checker_._M_t);
        iVar27 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)pbVar11);
        local_178._0_4_ = iVar27.node._0_4_;
        local_178._4_4_ = iVar27.node._4_4_;
        local_170 = iVar27.position;
        if (0xf < (ulong)((long)(b->
                                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .tree_.rightmost_ -
                         (long)(b->
                               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                         )) {
          uVar22 = 0;
          do {
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
            ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                         *)local_178);
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.root_.
                                          super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                   >> 2) >> 2);
        }
        local_148 = local_170;
        local_150[0] = SUB41(local_178._0_4_,0);
        local_150._1_7_ = (undefined7)(CONCAT44(local_178._4_4_,local_178._0_4_) >> 8);
        if (0xf < (ulong)((long)(b->
                                super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                .tree_.rightmost_ -
                         (long)(b->
                               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                         )) {
          uVar22 = 0;
          do {
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
            ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                         *)local_150);
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.rightmost_ -
                                    (long)(b->
                                          super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                                          ).tree_.
                                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .
                                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                                          .tree_.root_.
                                          super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                                   >> 2) >> 2);
        }
        begin_00.node._4_4_ = local_178._4_4_;
        begin_00.node._0_4_ = local_178._0_4_;
        begin_00.position = local_170;
        end_02.node._1_7_ = local_150._1_7_;
        end_02.node._0_1_ = local_150[0];
        end_02.position = local_148;
        begin_00._12_4_ = 0;
        end_02._12_4_ = 0;
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::erase(pbVar11,begin_00,end_02);
        local_158.data_ =
             (AssertHelperData *)
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(pbVar11);
        pAVar20 = &local_158;
        uVar22 = (long)(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.rightmost_ -
                 (long)(b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ).tree_.
                       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                 >> 2;
        local_100.data_ = (AssertHelperData *)(uVar22 - (uVar22 >> 2));
        pAVar21 = &local_100;
        AVar23 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                           ((internal *)&local_168,"mutable_b.size()",
                            "values.size() - values.size() / 4",(unsigned_long *)pAVar20,
                            (unsigned_long *)pAVar21);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar23.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if (local_168.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_158);
          if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pAVar21 = (AssertHelper *)0x40542f;
          }
          else {
            pAVar21 = (AssertHelper *)(local_160->_M_dataplus)._M_p;
          }
          pAVar20 = (AssertHelper *)0x220;
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x220,(char *)pAVar21);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          _Var14 = extraout_RDX_18.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if (local_158.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_158.data_ + 8))();
            _Var14._M_head_impl = extraout_RDX_19;
          }
        }
        if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_160,local_160);
          _Var14._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_20.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::verify(pbVar11,(EVP_PKEY_CTX *)local_160,(uchar *)_Var14._M_head_impl,(size_t)pAVar20,
                 (uchar *)pAVar21,in_R9);
        base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
        ::clear(pbVar11);
LAB_00152226:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_f8.checker_._M_t);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        ~btree((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)&local_f8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_a8.checker_._M_t);
        btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
        ~btree((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)&local_a8);
        return;
      }
    }
    pcVar19 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
  else {
LAB_001522aa:
    pcVar19 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
LAB_001522a0:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar19);
LAB_0015228b:
  pcVar19 = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
  goto LAB_001522a0;
}

Assistant:

void DoTest(const char *, T *b, const std::vector<V> &values) {
        typename KeyOfValue<typename T::key_type, V>::type key_of_value;

        T &mutable_b = *b;
        const T &const_b = *b;

        // Test insert.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.insert(values[i]);
            mutable_b.value_check(values[i]);
        }
        ASSERT_EQ(mutable_b.size(), values.size());

        const_b.verify();

        // Test copy constructor.
        T b_copy(const_b);
        EXPECT_EQ(b_copy.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_copy.find(key_of_value(values[i])), values[i]);
        }

        // Test range constructor.
        T b_range(const_b.begin(), const_b.end());
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test range insertion for values that already exist.
        b_range.insert(b_copy.begin(), b_copy.end());
        b_range.verify();

        // Test range insertion for new values.
        b_range.clear();
        b_range.insert(b_copy.begin(), b_copy.end());
        EXPECT_EQ(b_range.size(), b_copy.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test assignment to self. Nothing should change.
        b_range.operator=(b_range);
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test assignment of new values.
        b_range.clear();
        b_range = b_copy;
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test swap.
        b_range.clear();
        b_range.swap(b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        b_range.swap(b_copy);

        // Test non-member function swap.
        swap(b_range, b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        swap(b_range, b_copy);

        // Test erase via values.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(key_of_value(values[i]));
            // Erasing a non-existent key should have no effect.
            ASSERT_EQ(mutable_b.erase(key_of_value(values[i])), 0);
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test erase via iterators.
        mutable_b = b_copy;
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(mutable_b.find(key_of_value(values[i])));
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test insert with hint.
        for (size_t i = 0; i < values.size(); i++) {
            mutable_b.insert(mutable_b.upper_bound(key_of_value(values[i])), values[i]);
        }

        const_b.verify();

        // Test range erase.
        mutable_b.erase(mutable_b.begin(), mutable_b.end());
        EXPECT_EQ(mutable_b.size(), 0);
        const_b.verify();

        // First half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_end = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_b.begin(), mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 2);
        const_b.verify();

        // Second half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_begin;
        mutable_b.erase(mutable_iter_begin, mutable_b.end());
        EXPECT_EQ(mutable_b.size(), values.size() / 2);
        const_b.verify();

        // Second quarter.
        mutable_b = b_copy;
        mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_begin;
        mutable_iter_end = mutable_iter_begin;
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_iter_begin, mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 4);
        const_b.verify();

        mutable_b.clear();
    }